

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3DLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::Q3DImporter::CanRead(Q3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string extension;
  char *tokens [2];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"q3s");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"q3o");
    if (!bVar1) {
      if (extension._M_string_length == 0 || checkSig) {
        if (pIOHandler != (IOSystem *)0x0) {
          tokens[0] = "quick3Do";
          tokens[1] = "quick3Ds";
          bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,2,200,false,false);
        }
      }
      else {
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool Q3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "q3s" || extension == "q3o")
        return true;
    else if (!extension.length() || checkSig)   {
        if (!pIOHandler)
            return true;
        const char* tokens[] = {"quick3Do","quick3Ds"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,2);
    }
    return false;
}